

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O1

size_t charmap_ConvertNext(char **input,uint8_t **output)

{
  Charmap *pCVar1;
  uint8_t uVar2;
  char cVar3;
  Charmap *pCVar4;
  size_t sVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  size_t unaff_RBP;
  char *pcVar9;
  char *fmt;
  WarningID id;
  uint8_t *puVar10;
  long lVar11;
  Charmap *pCVar12;
  Charmap *pCVar13;
  
  pCVar4 = *currentCharmap;
  pCVar1 = pCVar4 + 1;
  lVar11 = 0;
  pCVar13 = (Charmap *)0x0;
  pCVar12 = pCVar1;
  do {
    pcVar9 = *input;
    if ((*pcVar9 == '\0') || (sVar5 = (&pCVar12->usedNodes)[(byte)(*pcVar9 - 1)], sVar5 == 0)) {
      pcVar9 = pcVar9 + -lVar11;
      *input = pcVar9;
      if (pCVar13 == (Charmap *)0x0) {
        cVar3 = *pcVar9;
        if (cVar3 == '\0') {
          pCVar13 = (Charmap *)0x0;
          bVar6 = false;
          unaff_RBP = 0;
        }
        else {
          if (output == (uint8_t **)0x0) {
            puVar10 = (uint8_t *)0x0;
          }
          else {
            puVar10 = *output;
          }
          unaff_RBP = readUTF8Char(puVar10,pcVar9);
          if (unaff_RBP == 0) {
            error("Input string is not valid UTF-8\n");
          }
          *input = *input + unaff_RBP;
          if (output != (uint8_t **)0x0) {
            *output = *output + unaff_RBP;
          }
          if (pCVar4->usedNodes < 2) {
            iVar7 = strcmp(pCVar4->name,"main");
            if (iVar7 != 0) {
              pcVar9 = printChar((int)cVar3);
              id = WARNING_UNMAPPED_CHAR_2;
              fmt = "Unmapped character %s not in main charmap\n";
              goto LAB_0010aa40;
            }
          }
          else {
            pcVar9 = printChar((int)cVar3);
            id = WARNING_UNMAPPED_CHAR_1;
            fmt = "Unmapped character %s\n";
LAB_0010aa40:
            warning(id,fmt,pcVar9);
          }
          pCVar13 = (Charmap *)0x0;
          bVar6 = false;
        }
      }
      else {
        unaff_RBP = 1;
        if (output != (uint8_t **)0x0) {
          uVar2 = *(uint8_t *)((long)&pCVar13->name + 1);
          puVar10 = *output;
          *output = puVar10 + 1;
          *puVar10 = uVar2;
        }
        bVar6 = false;
      }
    }
    else {
      *input = pcVar9 + 1;
      lVar8 = sVar5 * 0x800;
      pCVar12 = (Charmap *)((long)pCVar1 + lVar8);
      if (*(char *)((long)pCVar1 + lVar8) == '\0') {
        lVar11 = lVar11 + 1;
      }
      else {
        lVar11 = 0;
        pCVar13 = pCVar12;
      }
      bVar6 = true;
    }
    if (!bVar6) {
      return unaff_RBP;
    }
  } while( true );
}

Assistant:

size_t charmap_ConvertNext(char const **input, uint8_t **output)
{
	// The goal is to match the longest mapping possible.
	// For that, advance through the trie with each character read.
	// If that would lead to a dead end, rewind characters until the last match, and output.
	// If no match, read a UTF-8 codepoint and output that.
	struct Charmap const *charmap = *currentCharmap;
	struct Charnode const *node = &charmap->nodes[0];
	struct Charnode const *match = NULL;
	size_t rewindDistance = 0;

	for (;;) {
		uint8_t c = **input - 1;

		if (**input && node->next[c]) {
			// Consume that char
			(*input)++;
			rewindDistance++;

			// Advance to next node (index starts at 1)
			node = &charmap->nodes[node->next[c]];
			if (node->isTerminal) {
				// This node matches, register it
				match = node;
				rewindDistance = 0; // If no longer match is found, rewind here
			}

		} else {
			// We are at a dead end (either because we reached the end of input, or of
			// the trie), so rewind up to the last match, and output.
			*input -= rewindDistance; // This will rewind all the way if no match found

			if (match) { // A match was found, use it
				if (output)
					*(*output)++ = match->value;

				return 1;

			} else if (**input) { // No match found, but there is some input left
				int firstChar = **input;
				// This will write the codepoint's value to `output`, little-endian
				size_t codepointLen = readUTF8Char(output ? *output : NULL,
								   *input);

				if (codepointLen == 0)
					error("Input string is not valid UTF-8\n");

				// OK because UTF-8 has no NUL in multi-byte chars
				*input += codepointLen;
				if (output)
					*output += codepointLen;

				// Warn if this character is not mapped but any others are
				if (charmap->usedNodes > 1)
					warning(WARNING_UNMAPPED_CHAR_1,
						"Unmapped character %s\n", printChar(firstChar));
				else if (strcmp(charmap->name, DEFAULT_CHARMAP_NAME))
					warning(WARNING_UNMAPPED_CHAR_2,
						"Unmapped character %s not in " DEFAULT_CHARMAP_NAME
						" charmap\n", printChar(firstChar));

				return codepointLen;

			} else { // End of input
				return 0;
			}
		}
	}
}